

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O1

int ecp_mod_p384(mbedtls_mpi *N)

{
  ulong *puVar1;
  mbedtls_mpi_uint *pmVar2;
  mbedtls_mpi_uint mVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  char cVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  mbedtls_mpi C;
  mbedtls_mpi_uint Cp [7];
  mbedtls_mpi local_80;
  mbedtls_mpi_uint local_68 [7];
  
  local_80.s = 1;
  local_80.n = 7;
  local_80.p = local_68;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_68[4] = 0;
  local_68[5] = 0;
  local_68[6] = 0;
  iVar4 = mbedtls_mpi_grow(N,0xc);
  if (iVar4 == 0) {
    pmVar2 = N->p;
    mVar3 = *pmVar2;
    uVar10 = pmVar2[6];
    uVar7 = (uint)uVar10;
    uVar6 = (uint)mVar3;
    uVar14 = uVar7 + uVar6;
    uVar13 = (uint)(pmVar2[10] >> 0x20);
    uVar15 = uVar14 + uVar13;
    uVar9 = (uint)pmVar2[10];
    uVar16 = uVar15 + uVar9;
    uVar12 = (uint)(pmVar2[0xb] >> 0x20);
    iVar17 = uVar16 - uVar12;
    cVar11 = (CARRY4(uVar14,uVar13) + CARRY4(uVar7,uVar6) + CARRY4(uVar15,uVar9)) -
             (uVar16 < uVar12);
    *(int *)pmVar2 = iVar17;
    uVar14 = (uint)cVar11;
    uVar6 = (uint)(mVar3 >> 0x20);
    if (cVar11 < '\0') {
      cVar11 = -(uVar6 < -uVar14);
    }
    else {
      cVar11 = CARRY4(uVar14,uVar6);
    }
    uVar29 = (uint)(uVar10 >> 0x20);
    uVar16 = uVar14 + uVar6 + uVar29;
    uVar15 = (uint)pmVar2[0xb];
    uVar19 = uVar16 + uVar15;
    uVar20 = uVar19 + uVar12;
    uVar21 = uVar20 - uVar7;
    cVar11 = ((CARRY4(uVar16,uVar15) + cVar11 + CARRY4(uVar14 + uVar6,uVar29) +
              CARRY4(uVar19,uVar12)) - (uVar20 < uVar7)) - (uVar21 < uVar9);
    *pmVar2 = CONCAT44(uVar21 - uVar9,iVar17);
    uVar18 = pmVar2[1];
    uVar14 = (uint)cVar11;
    uVar6 = (uint)uVar18;
    if (cVar11 < '\0') {
      cVar11 = -(uVar6 < -uVar14);
    }
    else {
      cVar11 = CARRY4(uVar14,uVar6);
    }
    uVar16 = (uint)pmVar2[7];
    uVar19 = uVar14 + uVar6 + uVar16;
    uVar20 = uVar19 + uVar12;
    uVar21 = uVar20 - uVar29;
    uVar30 = uVar21 - uVar13;
    cVar11 = ((CARRY4(uVar14 + uVar6,uVar16) + cVar11 + CARRY4(uVar19,uVar12)) - (uVar20 < uVar29))
             - (uVar21 < uVar13);
    pmVar2[1] = uVar18 & 0xffffffff00000000 | (ulong)uVar30;
    uVar14 = (uint)cVar11;
    uVar6 = (uint)(uVar18 >> 0x20);
    if (cVar11 < '\0') {
      cVar11 = -(uVar6 < -uVar14);
    }
    else {
      cVar11 = CARRY4(uVar14,uVar6);
    }
    uVar19 = (uint)(pmVar2[7] >> 0x20);
    uVar20 = uVar14 + uVar6 + uVar19;
    uVar21 = uVar20 + uVar7;
    uVar22 = uVar21 + uVar9;
    uVar23 = uVar22 + uVar13;
    uVar24 = uVar23 - uVar16;
    uVar25 = uVar24 - uVar15;
    cVar11 = (((CARRY4(uVar21,uVar9) + CARRY4(uVar14 + uVar6,uVar19) + cVar11 + CARRY4(uVar20,uVar7)
               + CARRY4(uVar22,uVar13)) - (uVar23 < uVar16)) - (uVar24 < uVar15)) -
             (uVar25 < uVar12);
    pmVar2[1] = CONCAT44(uVar25 - uVar12,uVar30);
    uVar18 = pmVar2[2];
    uVar14 = (uint)cVar11;
    uVar6 = (uint)uVar18;
    if (cVar11 < '\0') {
      cVar11 = -(uVar6 < -uVar14);
    }
    else {
      cVar11 = CARRY4(uVar14,uVar6);
    }
    uVar20 = uVar14 + uVar6 + uVar13;
    uVar21 = uVar20 + uVar13;
    uVar31 = (uint)pmVar2[8];
    uVar30 = uVar21 + uVar31;
    uVar22 = uVar30 + uVar29;
    uVar23 = uVar22 + uVar7;
    uVar24 = uVar23 + uVar9;
    uVar25 = uVar24 + uVar15;
    uVar26 = uVar25 - uVar19;
    uVar27 = uVar26 - uVar12;
    uVar28 = uVar27 - uVar12;
    cVar11 = (((CARRY4(uVar23,uVar9) +
                CARRY4(uVar30,uVar29) +
                CARRY4(uVar20,uVar13) + cVar11 + CARRY4(uVar14 + uVar6,uVar13) +
                CARRY4(uVar21,uVar31) + CARRY4(uVar22,uVar7) + CARRY4(uVar24,uVar15)) -
              (uVar25 < uVar19)) - (uVar26 < uVar12)) - (uVar27 < uVar12);
    pmVar2[2] = uVar18 & 0xffffffff00000000 | (ulong)uVar28;
    uVar6 = (uint)cVar11;
    uVar14 = (uint)(uVar18 >> 0x20);
    if (cVar11 < '\0') {
      cVar11 = -(uVar14 < -uVar6);
    }
    else {
      cVar11 = CARRY4(uVar6,uVar14);
    }
    uVar7 = uVar6 + uVar14 + uVar15;
    uVar20 = uVar7 + uVar15;
    uVar25 = (uint)(pmVar2[8] >> 0x20);
    uVar21 = uVar20 + uVar25;
    uVar30 = uVar21 + uVar16;
    uVar22 = uVar30 + uVar29;
    uVar23 = uVar22 + uVar13;
    uVar24 = uVar23 + uVar12;
    cVar11 = (CARRY4(uVar22,uVar13) +
              CARRY4(uVar21,uVar16) +
              CARRY4(uVar7,uVar15) + cVar11 + CARRY4(uVar6 + uVar14,uVar15) + CARRY4(uVar20,uVar25)
              + CARRY4(uVar30,uVar29) + CARRY4(uVar23,uVar12)) - (uVar24 < uVar31);
    pmVar2[2] = CONCAT44(uVar24 - uVar31,uVar28);
    uVar18 = pmVar2[3];
    uVar14 = (uint)cVar11;
    uVar6 = (uint)uVar18;
    if (cVar11 < '\0') {
      cVar11 = -(uVar6 < -uVar14);
    }
    else {
      cVar11 = CARRY4(uVar14,uVar6);
    }
    uVar7 = uVar14 + uVar6 + uVar12;
    uVar20 = uVar7 + uVar12;
    uVar24 = (uint)pmVar2[9];
    uVar21 = uVar20 + uVar24;
    uVar29 = uVar21 + uVar19;
    uVar30 = uVar29 + uVar16;
    uVar22 = uVar30 + uVar15;
    uVar23 = uVar22 - uVar25;
    cVar11 = (CARRY4(uVar29,uVar16) +
              CARRY4(uVar20,uVar24) + CARRY4(uVar14 + uVar6,uVar12) + cVar11 + CARRY4(uVar7,uVar12)
              + CARRY4(uVar21,uVar19) + CARRY4(uVar30,uVar15)) - (uVar22 < uVar25);
    pmVar2[3] = uVar18 & 0xffffffff00000000 | (ulong)uVar23;
    uVar6 = (uint)cVar11;
    uVar14 = (uint)(uVar18 >> 0x20);
    if (cVar11 < '\0') {
      cVar11 = -(uVar14 < -uVar6);
    }
    else {
      cVar11 = CARRY4(uVar6,uVar14);
    }
    uVar29 = (uint)(pmVar2[9] >> 0x20);
    uVar16 = uVar6 + uVar14 + uVar29;
    uVar7 = uVar16 + uVar31;
    uVar20 = uVar7 + uVar19;
    uVar21 = uVar20 + uVar12;
    cVar11 = (CARRY4(uVar7,uVar19) + CARRY4(uVar6 + uVar14,uVar29) + cVar11 + CARRY4(uVar16,uVar31)
             + CARRY4(uVar20,uVar12)) - (uVar21 < uVar24);
    pmVar2[3] = CONCAT44(uVar21 - uVar24,uVar23);
    uVar18 = pmVar2[4];
    uVar6 = (uint)cVar11;
    uVar14 = (uint)uVar18;
    if (cVar11 < '\0') {
      cVar11 = -(uVar14 < -uVar6);
    }
    else {
      cVar11 = CARRY4(uVar6,uVar14);
    }
    uVar16 = uVar6 + uVar14 + uVar9;
    uVar7 = uVar16 + uVar25;
    uVar19 = uVar7 + uVar31;
    uVar20 = uVar19 - uVar29;
    cVar11 = (CARRY4(uVar16,uVar25) + cVar11 + CARRY4(uVar6 + uVar14,uVar9) + CARRY4(uVar7,uVar31))
             - (uVar19 < uVar29);
    pmVar2[4] = uVar18 & 0xffffffff00000000 | (ulong)uVar20;
    uVar6 = (uint)cVar11;
    uVar14 = (uint)(uVar18 >> 0x20);
    if (cVar11 < '\0') {
      cVar11 = -(uVar14 < -uVar6);
    }
    else {
      cVar11 = CARRY4(uVar6,uVar14);
    }
    uVar16 = uVar6 + uVar14 + uVar13;
    uVar7 = uVar16 + uVar24;
    uVar19 = uVar7 + uVar25;
    cVar11 = (CARRY4(uVar16,uVar24) + cVar11 + CARRY4(uVar6 + uVar14,uVar13) + CARRY4(uVar7,uVar25))
             - (uVar19 < uVar9);
    pmVar2[4] = CONCAT44(uVar19 - uVar9,uVar20);
    uVar18 = pmVar2[5];
    uVar6 = (uint)cVar11;
    uVar14 = (uint)uVar18;
    if (cVar11 < '\0') {
      cVar11 = -(uVar14 < -uVar6);
    }
    else {
      cVar11 = CARRY4(uVar6,uVar14);
    }
    uVar16 = uVar6 + uVar14 + uVar15;
    uVar7 = uVar16 + uVar29;
    uVar19 = uVar7 + uVar24;
    uVar20 = uVar19 - uVar13;
    cVar11 = (CARRY4(uVar16,uVar29) + cVar11 + CARRY4(uVar6 + uVar14,uVar15) + CARRY4(uVar7,uVar24))
             - (uVar19 < uVar13);
    pmVar2[5] = uVar18 & 0xffffffff00000000 | (ulong)uVar20;
    uVar6 = (uint)cVar11;
    uVar13 = (uint)(uVar18 >> 0x20);
    if (cVar11 < '\0') {
      cVar11 = -(uVar13 < -uVar6);
    }
    else {
      cVar11 = CARRY4(uVar6,uVar13);
    }
    uVar14 = uVar6 + uVar13 + uVar12;
    uVar16 = uVar14 + uVar9;
    uVar7 = uVar16 + uVar29;
    bVar5 = (CARRY4(uVar14,uVar9) + cVar11 + CARRY4(uVar6 + uVar13,uVar12) + CARRY4(uVar16,uVar29))
            - (uVar7 < uVar15);
    bVar8 = 0;
    if ('\0' < (char)bVar5) {
      bVar8 = bVar5;
    }
    pmVar2[5] = CONCAT44(uVar7 - uVar15,uVar20);
    pmVar2[6] = (ulong)bVar8 | uVar10 & 0xffffffff00000000;
    if (0xd < N->n * 2) {
      uVar10 = 0xc;
      do {
        uVar18 = 0xffffffff00000000;
        if ((uVar10 & 1) == 0) {
          uVar18 = 0xffffffff;
        }
        puVar1 = (ulong *)((long)pmVar2 + (uVar10 + 1 & 0xfffffffffffffffe) * 4);
        *puVar1 = *puVar1 & uVar18;
        uVar18 = uVar10 + 2;
        uVar10 = uVar10 + 1;
      } while (uVar18 < N->n * 2);
    }
    if ((char)bVar5 < '\0') {
      local_80.p[local_80.n - 1] = (ulong)(byte)-bVar5;
      iVar17 = mbedtls_mpi_sub_abs(N,&local_80,N);
      if (iVar17 == 0) {
        N->s = -1;
      }
    }
  }
  return iVar4;
}

Assistant:

static int ecp_mod_p384( mbedtls_mpi *N )
{
    INIT( 384 );

    ADD( 12 ); ADD( 21 ); ADD( 20 );
    SUB( 23 );                                              NEXT; // A0

    ADD( 13 ); ADD( 22 ); ADD( 23 );
    SUB( 12 ); SUB( 20 );                                   NEXT; // A2

    ADD( 14 ); ADD( 23 );
    SUB( 13 ); SUB( 21 );                                   NEXT; // A2

    ADD( 15 ); ADD( 12 ); ADD( 20 ); ADD( 21 );
    SUB( 14 ); SUB( 22 ); SUB( 23 );                        NEXT; // A3

    ADD( 21 ); ADD( 21 ); ADD( 16 ); ADD( 13 ); ADD( 12 ); ADD( 20 ); ADD( 22 );
    SUB( 15 ); SUB( 23 ); SUB( 23 );                        NEXT; // A4

    ADD( 22 ); ADD( 22 ); ADD( 17 ); ADD( 14 ); ADD( 13 ); ADD( 21 ); ADD( 23 );
    SUB( 16 );                                              NEXT; // A5

    ADD( 23 ); ADD( 23 ); ADD( 18 ); ADD( 15 ); ADD( 14 ); ADD( 22 );
    SUB( 17 );                                              NEXT; // A6

    ADD( 19 ); ADD( 16 ); ADD( 15 ); ADD( 23 );
    SUB( 18 );                                              NEXT; // A7

    ADD( 20 ); ADD( 17 ); ADD( 16 );
    SUB( 19 );                                              NEXT; // A8

    ADD( 21 ); ADD( 18 ); ADD( 17 );
    SUB( 20 );                                              NEXT; // A9

    ADD( 22 ); ADD( 19 ); ADD( 18 );
    SUB( 21 );                                              NEXT; // A10

    ADD( 23 ); ADD( 20 ); ADD( 19 );
    SUB( 22 );                                              LAST; // A11

cleanup:
    return( ret );
}